

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void __thiscall wallet::ReserveDestination::ReturnDestination(ReserveDestination *this)

{
  long lVar1;
  long *plVar2;
  CNoDestination *in_RDI;
  long in_FS_OFFSET;
  CNoDestination *in_stack_ffffffffffffffb8;
  CNoDestination *__rhs;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __rhs = in_RDI;
  if (*(long *)((long)&(in_RDI->m_script).super_CScriptBase._union + 0x18) != -1) {
    plVar2 = *(long **)((long)&(in_RDI->m_script).super_CScriptBase._union + 8);
    (**(code **)(*plVar2 + 0x40))
              (plVar2,*(undefined8 *)((long)&(in_RDI->m_script).super_CScriptBase._union + 0x18),
               in_RDI[3].m_script.super_CScriptBase._union.direct[0x10] & 1,in_RDI + 1);
  }
  *(undefined8 *)((long)&(in_RDI->m_script).super_CScriptBase._union + 0x18) = 0xffffffffffffffff;
  this_00 = (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)0x0;
  CNoDestination::CNoDestination(in_stack_ffffffffffffffb8);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::operator=(this_00,__rhs);
  CNoDestination::~CNoDestination(in_stack_ffffffffffffffb8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ReserveDestination::ReturnDestination()
{
    if (nIndex != -1) {
        m_spk_man->ReturnDestination(nIndex, fInternal, address);
    }
    nIndex = -1;
    address = CNoDestination();
}